

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::remap_swizzle
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *out_type,
          uint32_t input_components,string *expr)

{
  uint *puVar1;
  char *pcVar2;
  char (*in_R9) [2];
  uint local_88;
  uint local_84;
  undefined1 local_80 [4];
  uint32_t c;
  undefined1 local_5d;
  spirv_cross local_50 [32];
  string *local_30;
  string *expr_local;
  SPIRType *pSStack_20;
  uint32_t input_components_local;
  SPIRType *out_type_local;
  CompilerGLSL *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  
  local_30 = expr;
  expr_local._4_4_ = input_components;
  pSStack_20 = out_type;
  out_type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  if (out_type->vecsize == input_components) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)expr);
  }
  else if ((input_components == 1) && (((this->backend).can_swizzle_scalar & 1U) == 0)) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_50,this,out_type,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
              (__return_storage_ptr__,local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ac375,
               (char (*) [2])local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,in_R9);
    ::std::__cxx11::string::~string((string *)local_50);
  }
  else {
    local_5d = 0;
    enclose_expression((string *)local_80,this,expr);
    ::std::operator+(__return_storage_ptr__,(string *)local_80,".");
    ::std::__cxx11::string::~string((string *)local_80);
    for (local_84 = 0; local_84 < pSStack_20->vecsize; local_84 = local_84 + 1) {
      local_88 = expr_local._4_4_ - 1;
      puVar1 = ::std::min<unsigned_int>(&local_84,&local_88);
      pcVar2 = index_to_swizzle(this,*puVar1);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
    }
    if ((((this->backend).swizzle_is_function & 1U) != 0) && (1 < pSStack_20->vecsize)) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"()");
    }
    remove_duplicate_swizzle(this,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::remap_swizzle(const SPIRType &out_type, uint32_t input_components, const string &expr)
{
	if (out_type.vecsize == input_components)
		return expr;
	else if (input_components == 1 && !backend.can_swizzle_scalar)
		return join(type_to_glsl(out_type), "(", expr, ")");
	else
	{
		// FIXME: This will not work with packed expressions.
		auto e = enclose_expression(expr) + ".";
		// Just clamp the swizzle index if we have more outputs than inputs.
		for (uint32_t c = 0; c < out_type.vecsize; c++)
			e += index_to_swizzle(min(c, input_components - 1));
		if (backend.swizzle_is_function && out_type.vecsize > 1)
			e += "()";

		remove_duplicate_swizzle(e);
		return e;
	}
}